

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::ensure_param(float *v,float lo,float hi,float def,char *string)

{
  ostream *poVar1;
  
  if ((*v < lo) || (hi < *v)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,string);
    std::endl<char,std::char_traits<char>>(poVar1);
    *v = def;
  }
  return;
}

Assistant:

void ensure_param(float& v, float lo, float hi, float def, const char* string)
{
  if ((v < lo) || (v > hi))
  {
    std::cerr << string << endl;
    v = def;
  }
}